

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_utils.h
# Opt level: O0

void transpose4x16_sse2(__m128i *x,__m128i *d)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined1 auVar7 [16];
  __m128i ww3;
  __m128i ww2;
  __m128i ww1;
  __m128i ww0;
  __m128i w3;
  __m128i w2;
  __m128i w1;
  __m128i w0;
  
  auVar2 = vpunpcklbw_avx(*in_RDI,in_RDI[1]);
  auVar3 = vpunpcklbw_avx(in_RDI[2],in_RDI[3]);
  auVar7 = vpunpckhbw_avx(*in_RDI,in_RDI[1]);
  auVar1 = vpunpckhbw_avx(in_RDI[2],in_RDI[3]);
  auVar4 = vpunpcklwd_avx(auVar2,auVar3);
  auVar5 = vpunpcklwd_avx(auVar7,auVar1);
  auVar2 = vpunpckhwd_avx(auVar2,auVar3);
  auVar7 = vpunpckhwd_avx(auVar7,auVar1);
  auVar3 = vpunpckldq_avx(auVar4,auVar5);
  auVar6 = vpunpckldq_avx(auVar2,auVar7);
  auVar1 = vpunpckhdq_avx(auVar4,auVar5);
  auVar7 = vpunpckhdq_avx(auVar2,auVar7);
  auVar2 = vpunpcklqdq_avx(auVar3,auVar6);
  *in_RSI = auVar2;
  auVar2 = vpunpckhqdq_avx(auVar3,auVar6);
  in_RSI[1] = auVar2;
  auVar2 = vpunpcklqdq_avx(auVar1,auVar7);
  in_RSI[2] = auVar2;
  auVar7 = vpunpckhqdq_avx(auVar1,auVar7);
  in_RSI[3] = auVar7;
  auVar7 = vpsrldq_avx(*in_RSI,8);
  in_RSI[4] = auVar7;
  auVar7 = vpsrldq_avx(in_RSI[1],8);
  in_RSI[5] = auVar7;
  auVar7 = vpsrldq_avx(in_RSI[2],8);
  in_RSI[6] = auVar7;
  auVar7 = vpsrldq_avx(in_RSI[3],8);
  in_RSI[7] = auVar7;
  auVar7 = vpsrldq_avx(*in_RSI,4);
  in_RSI[8] = auVar7;
  auVar7 = vpsrldq_avx(in_RSI[1],4);
  in_RSI[9] = auVar7;
  auVar7 = vpsrldq_avx(in_RSI[2],4);
  in_RSI[10] = auVar7;
  auVar7 = vpsrldq_avx(in_RSI[3],4);
  in_RSI[0xb] = auVar7;
  auVar7 = vpsrldq_avx(*in_RSI,0xc);
  in_RSI[0xc] = auVar7;
  auVar7 = vpsrldq_avx(in_RSI[1],0xc);
  in_RSI[0xd] = auVar7;
  auVar7 = vpsrldq_avx(in_RSI[2],0xc);
  in_RSI[0xe] = auVar7;
  auVar7 = vpsrldq_avx(in_RSI[3],0xc);
  in_RSI[0xf] = auVar7;
  return;
}

Assistant:

static inline void transpose4x16_sse2(__m128i *x, __m128i *d) {
  __m128i w0, w1, w2, w3, ww0, ww1, ww2, ww3;
  w0 = _mm_unpacklo_epi8(x[0], x[1]);
  w1 = _mm_unpacklo_epi8(x[2], x[3]);
  w2 = _mm_unpackhi_epi8(x[0], x[1]);
  w3 = _mm_unpackhi_epi8(x[2], x[3]);

  ww0 = _mm_unpacklo_epi16(w0, w1);
  ww1 = _mm_unpacklo_epi16(w2, w3);
  ww2 = _mm_unpackhi_epi16(w0, w1);
  ww3 = _mm_unpackhi_epi16(w2, w3);

  w0 = _mm_unpacklo_epi32(ww0, ww1);
  w2 = _mm_unpacklo_epi32(ww2, ww3);
  w1 = _mm_unpackhi_epi32(ww0, ww1);
  w3 = _mm_unpackhi_epi32(ww2, ww3);

  d[0] = _mm_unpacklo_epi64(w0, w2);
  d[1] = _mm_unpackhi_epi64(w0, w2);
  d[2] = _mm_unpacklo_epi64(w1, w3);
  d[3] = _mm_unpackhi_epi64(w1, w3);

  d[4] = _mm_srli_si128(d[0], 8);
  d[5] = _mm_srli_si128(d[1], 8);
  d[6] = _mm_srli_si128(d[2], 8);
  d[7] = _mm_srli_si128(d[3], 8);

  d[8] = _mm_srli_si128(d[0], 4);
  d[9] = _mm_srli_si128(d[1], 4);
  d[10] = _mm_srli_si128(d[2], 4);
  d[11] = _mm_srli_si128(d[3], 4);

  d[12] = _mm_srli_si128(d[0], 12);
  d[13] = _mm_srli_si128(d[1], 12);
  d[14] = _mm_srli_si128(d[2], 12);
  d[15] = _mm_srli_si128(d[3], 12);
}